

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_puzzle.cpp
# Opt level: O0

bool __thiscall
sliding_puzzle::SlidingPuzzle::generateSolvableStartState(SlidingPuzzle *this,int soln_lower_bound)

{
  char action;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  element_type *this_00;
  ostream *poVar8;
  int local_68;
  int local_64;
  int k_1;
  int j_1;
  int rand_ind;
  char successor_action [4];
  int i;
  __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  local_48 [8];
  SlidingPuzzleStatePtr new_state;
  SlidingPuzzleStatePtr rand_state;
  int local_20;
  int k;
  int j;
  int anchor_location [2];
  int soln_lower_bound_local;
  SlidingPuzzle *this_local;
  
  local_20 = 0;
  anchor_location[0] = soln_lower_bound;
  unique0x10000388 = this;
  while( true ) {
    peVar4 = std::
             __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->goal_);
    sVar5 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size(&peVar4->state_);
    if (sVar5 <= (ulong)(long)local_20) break;
    rand_state.super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = 0;
    while( true ) {
      peVar4 = std::
               __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->goal_);
      pvVar6 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&peVar4->state_,(long)local_20);
      sVar5 = std::vector<int,_std::allocator<int>_>::size(pvVar6);
      if (sVar5 <= (ulong)(long)rand_state.
                                super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi._4_4_) break;
      peVar4 = std::
               __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->goal_);
      pvVar6 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&peVar4->state_,(long)local_20);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (pvVar6,(long)rand_state.
                                       super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi._4_4_);
      if (*pvVar7 == puzzle_anchor) {
        k = local_20;
        j = rand_state.
            super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_;
      }
      rand_state.super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ =
           rand_state.
           super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi._4_4_ + 1;
    }
    local_20 = local_20 + 1;
  }
  std::
  __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)&this->goal_);
  std::make_shared<sliding_puzzle::SlidingPuzzleState,sliding_puzzle::SlidingPuzzleState&>
            ((SlidingPuzzleState *)
             &new_state.
              super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::make_shared<sliding_puzzle::SlidingPuzzleState>();
  rand_ind = 0;
  while (rand_ind < anchor_location[0]) {
    j_1 = 0x5357454e;
    iVar3 = rand();
    action = *(char *)((long)&j_1 + (long)(iVar3 % 4));
    peVar4 = std::
             __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*(local_48);
    bVar2 = generateSuccessorForAction
                      (this,(SlidingPuzzleStatePtr *)
                            &new_state.
                             super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount,&k,action,peVar4);
    if (bVar2) {
      local_64 = 0;
      while( true ) {
        peVar4 = std::
                 __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(local_48);
        sVar5 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::size(&peVar4->state_);
        if (sVar5 <= (ulong)(long)local_64) break;
        local_68 = 0;
        while( true ) {
          peVar4 = std::
                   __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(local_48);
          pvVar6 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&peVar4->state_,(long)local_64);
          sVar5 = std::vector<int,_std::allocator<int>_>::size(pvVar6);
          if (sVar5 <= (ulong)(long)local_68) break;
          peVar4 = std::
                   __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(local_48);
          pvVar6 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&peVar4->state_,(long)local_64);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)local_68);
          if (*pvVar7 == puzzle_anchor) {
            k = local_64;
            j = local_68;
          }
          local_68 = local_68 + 1;
        }
        local_64 = local_64 + 1;
      }
      peVar4 = std::
               __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(local_48);
      this_00 = std::
                __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&new_state.
                                super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
      SlidingPuzzleState::operator=(this_00,peVar4);
      rand_ind = rand_ind + 1;
    }
  }
  std::shared_ptr<sliding_puzzle::SlidingPuzzleState>::operator=
            (&this->start_,
             (shared_ptr<sliding_puzzle::SlidingPuzzleState> *)
             &new_state.
              super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  poVar8 = std::operator<<((ostream *)&std::cout,"The solvable start state is: ");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  peVar4 = std::
           __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->start_);
  poVar8 = operator<<((ostream *)&std::cout,peVar4);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

bool SlidingPuzzle::generateSolvableStartState(int soln_lower_bound)
{
  int anchor_location[2];

  for (int j=0; j<goal_->state_.size(); ++j)
  {
    for (int k=0; k<goal_->state_[j].size(); ++k)
    {
      if (goal_->state_[j][k] == puzzle_anchor)
      {
        anchor_location[0] = j;
        anchor_location[1] = k;
      }
    }
  }

  SlidingPuzzleStatePtr rand_state = std::make_shared<SlidingPuzzleState>(*goal_);
  SlidingPuzzleStatePtr new_state = std::make_shared<SlidingPuzzleState>();

  for (int i=0; i<soln_lower_bound;)
  {
    char successor_action[] = {'N', 'E', 'W', 'S'};
    int rand_ind = rand() % static_cast<int>(4);


    if (generateSuccessorForAction(rand_state,
                                   anchor_location,
                                   successor_action[rand_ind],
                                   *new_state))
    {
      for (int j=0; j<new_state->state_.size(); ++j)
      {
        for (int k=0; k<new_state->state_[j].size(); ++k)
        {
          if (new_state->state_[j][k] == puzzle_anchor)
          {
            anchor_location[0] = j;
            anchor_location[1] = k;
          }
        }
      }

      *rand_state = *new_state;
      ++i;
    }
  }

  start_ = rand_state;

  std::cout << "The solvable start state is: " << std::endl;
  std::cout << *start_ << std::endl;

}